

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::HasEnumDefinitions(FileDescriptor *file)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  if (*(int *)(file + 0x68) < 1) {
    uVar1 = *(uint *)(file + 0x58);
    lVar4 = 0;
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    uVar3 = 0;
    do {
      if (uVar5 == uVar3) {
        return (long)uVar3 < (long)(int)uVar1;
      }
      bVar2 = HasEnumDefinitions((Descriptor *)(*(long *)(file + 0x60) + lVar4));
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0xa8;
    } while (!bVar2);
  }
  return true;
}

Assistant:

bool HasEnumDefinitions(const FileDescriptor* file) {
  if (file->enum_type_count() > 0) return true;
  for (int i = 0; i < file->message_type_count(); ++i) {
    if (HasEnumDefinitions(file->message_type(i))) return true;
  }
  return false;
}